

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * toString_abi_cxx11_(string *__return_storage_ptr__,XMLError error)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  switch(error) {
  case XML_SUCCESS:
    __s = "XML_SUCCESS";
    break;
  case XML_NO_ATTRIBUTE:
    __s = "XML_NO_ATTRIBUTE";
    break;
  case XML_WRONG_ATTRIBUTE_TYPE:
    __s = "XML_WRONG_ATTRIBUTE_TYPE";
    break;
  case XML_ERROR_FILE_NOT_FOUND:
    __s = "XML_ERROR_FILE_NOT_FOUND";
    break;
  case XML_ERROR_FILE_COULD_NOT_BE_OPENED:
    __s = "XML_ERROR_FILE_COULD_NOT_BE_OPENED";
    break;
  case XML_ERROR_FILE_READ_ERROR:
    __s = "XML_ERROR_FILE_READ_ERROR";
    break;
  case XML_ERROR_PARSING_ELEMENT:
    __s = "XML_ERROR_PARSING_ELEMENT";
    break;
  case XML_ERROR_PARSING_ATTRIBUTE:
    __s = "XML_ERROR_PARSING_ATTRIBUTE";
    break;
  case XML_ERROR_PARSING_TEXT:
    __s = "XML_ERROR_PARSING_TEXT";
    break;
  case XML_ERROR_PARSING_CDATA:
    __s = "XML_ERROR_PARSING_CDATA";
    break;
  case XML_ERROR_PARSING_COMMENT:
    __s = "XML_ERROR_PARSING_COMMENT";
    break;
  case XML_ERROR_PARSING_DECLARATION:
    __s = "XML_ERROR_PARSING_DECLARATION";
    break;
  case XML_ERROR_PARSING_UNKNOWN:
    __s = "XML_ERROR_PARSING_UNKNOWN";
    break;
  case XML_ERROR_EMPTY_DOCUMENT:
    __s = "XML_ERROR_EMPTY_DOCUMENT";
    break;
  case XML_ERROR_MISMATCHED_ELEMENT:
    __s = "XML_ERROR_MISMATCHED_ELEMENT";
    break;
  case XML_ERROR_PARSING:
    __s = "XML_ERROR_PARSING";
    break;
  case XML_CAN_NOT_CONVERT_TEXT:
    __s = "XML_CAN_NOT_CONVERT_TEXT";
    break;
  case XML_NO_TEXT_NODE:
    __s = "XML_NO_TEXT_NODE";
    break;
  default:
    std::__cxx11::to_string(&local_30,error);
    std::operator+(&local_50,"unknown error code <",&local_30);
    std::operator+(__return_storage_ptr__,&local_50,">");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString( tinyxml2::XMLError error )
{
  switch ( error )
  {
    case tinyxml2::XML_SUCCESS: return "XML_SUCCESS";
    case tinyxml2::XML_NO_ATTRIBUTE: return "XML_NO_ATTRIBUTE";
    case tinyxml2::XML_WRONG_ATTRIBUTE_TYPE: return "XML_WRONG_ATTRIBUTE_TYPE";
    case tinyxml2::XML_ERROR_FILE_NOT_FOUND: return "XML_ERROR_FILE_NOT_FOUND";
    case tinyxml2::XML_ERROR_FILE_COULD_NOT_BE_OPENED: return "XML_ERROR_FILE_COULD_NOT_BE_OPENED";
    case tinyxml2::XML_ERROR_FILE_READ_ERROR: return "XML_ERROR_FILE_READ_ERROR";
    case tinyxml2::XML_ERROR_PARSING_ELEMENT: return "XML_ERROR_PARSING_ELEMENT";
    case tinyxml2::XML_ERROR_PARSING_ATTRIBUTE: return "XML_ERROR_PARSING_ATTRIBUTE";
    case tinyxml2::XML_ERROR_PARSING_TEXT: return "XML_ERROR_PARSING_TEXT";
    case tinyxml2::XML_ERROR_PARSING_CDATA: return "XML_ERROR_PARSING_CDATA";
    case tinyxml2::XML_ERROR_PARSING_COMMENT: return "XML_ERROR_PARSING_COMMENT";
    case tinyxml2::XML_ERROR_PARSING_DECLARATION: return "XML_ERROR_PARSING_DECLARATION";
    case tinyxml2::XML_ERROR_PARSING_UNKNOWN: return "XML_ERROR_PARSING_UNKNOWN";
    case tinyxml2::XML_ERROR_EMPTY_DOCUMENT: return "XML_ERROR_EMPTY_DOCUMENT";
    case tinyxml2::XML_ERROR_MISMATCHED_ELEMENT: return "XML_ERROR_MISMATCHED_ELEMENT";
    case tinyxml2::XML_ERROR_PARSING: return "XML_ERROR_PARSING";
    case tinyxml2::XML_CAN_NOT_CONVERT_TEXT: return "XML_CAN_NOT_CONVERT_TEXT";
    case tinyxml2::XML_NO_TEXT_NODE: return "XML_NO_TEXT_NODE";
    default: return "unknown error code <" + std::to_string( error ) + ">";
  }
}